

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int try_disarm(trap *ttmp,boolean force_failure,schar dx,schar dy)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  obj *poVar6;
  trap *trap;
  bool bVar7;
  bool bVar8;
  char *local_50;
  monst *local_40;
  trap *ttmp2;
  boolean holdingtrap;
  boolean under_u;
  int ttype;
  monst *mtmp;
  schar dy_local;
  schar dx_local;
  boolean force_failure_local;
  trap *ttmp_local;
  
  if ((level->monsters[ttmp->tx][ttmp->ty] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[ttmp->tx][ttmp->ty]->field_0x60 >> 9 & 1) != 0)) {
    local_40 = (monst *)0x0;
  }
  else {
    local_40 = level->monsters[ttmp->tx][ttmp->ty];
  }
  uVar2 = (uint)(ttmp->field_0x8 & 0x1f);
  bVar7 = dx == '\0';
  bVar8 = dy == '\0';
  if ((local_40 != (monst *)0x0) &&
     (((*(uint *)&local_40->field_0x60 >> 0x17 & 1) == 0 || (uVar2 != 5 && uVar2 != 0x13)))) {
    pcVar5 = Monnam(local_40);
    pline("%s is in the way.",pcVar5);
    return 0;
  }
  poVar6 = sobj_at(0x214,level,(int)ttmp->tx,(int)ttmp->ty);
  if ((((poVar6 != (obj *)0x0) && (u.uprops[0x3e].intrinsic == 0)) &&
      (u.uprops[0x3e].extrinsic == 0)) &&
     ((((youmonst.data)->mflags1 & 8) == 0 && (!bVar7 || !bVar8)))) {
    pline("There is a boulder in your way.");
    return 0;
  }
  if (((dx == '\0') || (dy == '\0')) ||
     ((bVar1 = bad_rock(youmonst.data,'\x01',u.ux,ttmp->ty), bVar1 == '\0' ||
      (bVar1 = bad_rock(youmonst.data,'\x01',ttmp->tx,u.uy), bVar1 == '\0')))) {
LAB_00315e68:
    bVar1 = can_reach_floor();
    if (bVar1 == '\0') {
      if ((u.usteed == (monst *)0x0) || ('\x01' < u.weapon_skills[0x27].skill)) {
        pline("You are unable to reach the %s!",trapexplain[(int)(uVar2 - 1)]);
      }
      else {
        pcVar5 = mon_nam(u.usteed);
        pline("You aren\'t skilled enough to reach from %s.",pcVar5);
      }
      ttmp_local._4_4_ = 0;
    }
    else if ((force_failure == '\0') && (iVar3 = untrap_prob(ttmp), iVar3 == 0)) {
      ttmp_local._4_4_ = 2;
    }
    else {
      iVar3 = rnl(5);
      if (iVar3 == 0) {
        if ((char)ttmp->field_0x8 < '\0') {
          local_50 = "Your";
        }
        else {
          local_50 = "That";
          if (bVar7 && bVar8) {
            local_50 = "This";
          }
        }
        pcVar5 = "disarm";
        if (uVar2 == 0x13) {
          pcVar5 = "remove";
        }
        pline("%s %s is difficult to %s.",local_50,trapexplain[(int)(uVar2 - 1)],pcVar5);
      }
      else {
        pline("Whoops...");
        if (local_40 == (monst *)0x0) {
          if (bVar7 && bVar8) {
            dotrap(ttmp,0);
          }
          else {
            move_into_trap(ttmp);
          }
        }
        else if (uVar2 == 5) {
          if (local_40->mtame != '\0') {
            abuse_dog(local_40);
          }
          iVar3 = rnd(4);
          iVar3 = local_40->mhp - iVar3;
          local_40->mhp = iVar3;
          if (iVar3 < 1) {
            killed(local_40);
          }
        }
        else if (uVar2 == 0x13) {
          if ((youmonst.data == mons + 0x62) || (youmonst.data == mons + 100)) {
            pcVar5 = Monnam(local_40);
            pline("%s remains entangled.",pcVar5);
          }
          else {
            trap = maketrap(level,(int)u.ux,(int)u.uy,0x13);
            if (trap != (trap *)0x0) {
              pline("The webbing sticks to you. You\'re caught too!");
              dotrap(trap,1);
              if ((u.usteed != (monst *)0x0) && (u.utrap != 0)) {
                dismount_steed(1);
              }
            }
          }
        }
      }
      ttmp_local._4_4_ = 1;
    }
  }
  else {
    if (invent == (obj *)0x0) {
LAB_00315e24:
      if ((youmonst.data)->msize < 3) goto LAB_00315e68;
    }
    else {
      iVar3 = inv_weight();
      iVar4 = weight_cap();
      if (iVar3 + iVar4 < 0x259) goto LAB_00315e24;
    }
    pline("You are unable to reach the %s!",trapexplain[(int)(uVar2 - 1)]);
    ttmp_local._4_4_ = 0;
  }
  return ttmp_local._4_4_;
}

Assistant:

static int try_disarm(struct trap *ttmp, boolean force_failure, schar dx, schar dy)
{
	struct monst *mtmp = m_at(level, ttmp->tx,ttmp->ty);
	int ttype = ttmp->ttyp;
	boolean under_u = (!dx && !dy);
	boolean holdingtrap = (ttype == BEAR_TRAP || ttype == WEB);
	
	/* Test for monster first, monsters are displayed instead of trap. */
	if (mtmp && (!mtmp->mtrapped || !holdingtrap)) {
		pline("%s is in the way.", Monnam(mtmp));
		return 0;
	}
	/* We might be forced to move onto the trap's location. */
	if (sobj_at(BOULDER, level, ttmp->tx, ttmp->ty)
				&& !Passes_walls && !under_u) {
		pline("There is a boulder in your way.");
		return 0;
	}
	/* duplicate tight-space checks from test_move */
	if (dx && dy &&
	    bad_rock(youmonst.data, TRUE, u.ux, ttmp->ty) &&
	    bad_rock(youmonst.data, TRUE, ttmp->tx, u.uy)) {
	    if ((invent && (inv_weight() + weight_cap() > 600)) ||
		bigmonst(youmonst.data)) {
		/* don't allow untrap if they can't get thru to it */
		pline("You are unable to reach the %s!",
		    trapexplain[ttype-1]);
		return 0;
	    }
	}
	/* untrappable traps are located on the ground. */
	if (!can_reach_floor()) {
		if (u.usteed && P_SKILL(P_RIDING) < P_BASIC)
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
		else
			pline("You are unable to reach the %s!",
			trapexplain[ttype-1]);
		return 0;
	}

	/* Will our hero succeed? */
	if (force_failure || untrap_prob(ttmp)) {
		if (rnl(5)) {
		    pline("Whoops...");
		    if (mtmp) {		/* must be a trap that holds monsters */
			if (ttype == BEAR_TRAP) {
			    if (mtmp->mtame) abuse_dog(mtmp);
			    if ((mtmp->mhp -= rnd(4)) <= 0) killed(mtmp);
			} else if (ttype == WEB) {
			    if (!webmaker(youmonst.data)) {
				struct trap *ttmp2 = maketrap(level, u.ux, u.uy, WEB);
				if (ttmp2) {
				    pline("The webbing sticks to you. You're caught too!");
				    dotrap(ttmp2, NOWEBMSG);
				    if (u.usteed && u.utrap) {
					/* you, not steed, are trapped */
					dismount_steed(DISMOUNT_FELL);
				    }
				}
			    } else
				pline("%s remains entangled.", Monnam(mtmp));
			}
		    } else if (under_u) {
			dotrap(ttmp, 0);
		    } else {
			move_into_trap(ttmp);
		    }
		} else {
		    pline("%s %s is difficult to %s.",
			  ttmp->madeby_u ? "Your" : under_u ? "This" : "That",
			  trapexplain[ttype-1],
			  (ttype == WEB) ? "remove" : "disarm");
		}
		return 1;
	}
	return 2;
}